

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O1

void augment_colors(char *colors,int **attr,int *nattr)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *__dest;
  int iVar4;
  ulong uVar5;
  
  sVar3 = strlen(colors);
  iVar4 = (int)sVar3;
  if (*nattr < iVar4) {
    __dest = (int *)mem_alloc((long)iVar4 << 2);
    if (0 < (long)*nattr) {
      memcpy(__dest,*attr,(long)*nattr << 2);
    }
    mem_free(*attr);
    iVar1 = *nattr;
    if (iVar4 - iVar1 != 0 && iVar1 <= iVar4) {
      uVar5 = 0;
      do {
        iVar2 = color_char_to_attr(colors[uVar5 + (long)iVar1]);
        __dest[(long)iVar1 + uVar5] = iVar2;
        uVar5 = uVar5 + 1;
      } while ((uint)(iVar4 - iVar1) != uVar5);
    }
    *attr = __dest;
    *nattr = iVar4;
  }
  return;
}

Assistant:

static void augment_colors(const char *colors, int **attr, int *nattr)
{
	int n = (int) strlen(colors);

	if (*nattr < n) {
		int *newattr = mem_alloc(sizeof(*newattr) * n);

		if (*nattr > 0) {
			(void) memcpy(newattr, *attr, *nattr *
				sizeof(*newattr));
		}
		mem_free(*attr);
		convert_chars_to_attrs(colors + *nattr, n - *nattr,
			newattr + *nattr);
		*attr = newattr;
		*nattr = n;
	}
}